

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O1

void do_hide_and_save_proc(Am_Object *cmd)

{
  Am_Object_Method_Type *pAVar1;
  Am_Value *pAVar2;
  Am_Object window;
  Am_Object obj;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  local_20.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object((ushort)&local_28,(ulong)cmd);
  Am_Object::operator=(&local_20,&local_28);
  Am_Object::~Am_Object(&local_28);
  local_28.data = (Am_Object_Data *)0x0;
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_20,0x68);
  Am_Object::operator=(&local_28,pAVar2);
  Am_Object::Set((ushort)&local_28,true,0);
  pAVar1 = do_save_file.Call;
  Am_Object::Am_Object(&local_18,cmd);
  (*pAVar1)((Am_Object_Data *)&local_18);
  Am_Object::~Am_Object(&local_18);
  if (dirty == true) {
    Am_Object::Set((ushort)cmd,0x154,0);
  }
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_hide_and_save, (Am_Object cmd))
{
  Am_Object obj; // the cancel button
  obj = cmd.Get_Owner();
  Am_Object window;
  window = obj.Get(Am_WINDOW);
  window.Set(Am_VISIBLE, false);

  do_save_file.Call(cmd);

  if (dirty)
    cmd.Set(Am_IMPLEMENTATION_PARENT, 0);
}